

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

void panic(char *filename,int line,char *fmt,...)

{
  char in_AL;
  size_t sVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  char *pcVar2;
  undefined8 in_R9;
  char *pcVar3;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined1 local_4b8 [24];
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 local_490;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  undefined8 local_428;
  undefined8 local_418;
  char buffer [1000];
  
  args[0].reg_save_area = local_4b8;
  if (in_AL != '\0') {
    local_488 = in_XMM0_Qa;
    local_478 = in_XMM1_Qa;
    local_468 = in_XMM2_Qa;
    local_458 = in_XMM3_Qa;
    local_448 = in_XMM4_Qa;
    local_438 = in_XMM5_Qa;
    local_428 = in_XMM6_Qa;
    local_418 = in_XMM7_Qa;
  }
  args[0].gp_offset = 0x18;
  args[0].fp_offset = 0x30;
  args[0].overflow_arg_area = &stack0x00000008;
  pcVar2 = "\x1b[35m";
  if (!panic_use_colours) {
    pcVar2 = "";
  }
  pcVar3 = "\x1b[0m";
  if (!panic_use_colours) {
    pcVar3 = "";
  }
  local_4a0 = in_RCX;
  local_498 = in_R8;
  local_490 = in_R9;
  __sprintf_chk(buffer,1,1000,"%sCGREEN EXCEPTION%s: <%s:%d>",pcVar2,pcVar3,filename,line);
  sVar1 = strlen(buffer);
  __vsprintf_chk(buffer + sVar1,1,0xffffffffffffffff,fmt,args);
  if (panic_message_buffer == (char *)0x0) {
    __fprintf_chk(_stderr,1,"%s\n",buffer);
  }
  else {
    strcpy(panic_message_buffer,buffer);
  }
  return;
}

Assistant:

void panic(const char *filename, int line, const char *fmt, ...) {
    va_list args;
    char buffer[1000];

    va_start(args, fmt);
    sprintf(buffer, "%sCGREEN EXCEPTION%s: <%s:%d>",
            panic_use_colours?MAGENTA:"",
            panic_use_colours?RESET:"",
            filename, line);
    vsprintf(&buffer[strlen(buffer)], fmt, args);
    va_end(args);

    if (panic_message_buffer != NULL)
        strcpy(panic_message_buffer, buffer);
    else
        fprintf(stderr, "%s\n", buffer);
}